

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O3

void Abc_NtkDumpEquivFile(char *pFileName,Vec_Int_t *vClasses,Abc_Ntk_t **pNtks)

{
  Abc_Ntk_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint local_48;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file %s for writing.\n",pFileName);
    return;
  }
  pcVar6 = (*pNtks)->pName;
  pcVar9 = pNtks[1]->pName;
  pcVar5 = Extra_TimeStamp();
  fprintf(__stream,"# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n",
          pcVar6,pcVar9,pcVar5);
  if (0 < vClasses->nSize) {
    uVar7 = 0;
    local_48 = 0;
    do {
      if (((int)uVar7 < 0) || (uVar3 = vClasses->nSize, (int)uVar3 <= (int)uVar7)) {
LAB_002ae5df:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = (ulong)uVar7;
      local_48 = local_48 + 1;
      uVar10 = uVar8;
      while( true ) {
        uVar10 = uVar10 + 1;
        if ((int)(vClasses->pArray[uVar8] + uVar7 + 1) <= (int)uVar10) break;
        if (uVar3 <= uVar10) goto LAB_002ae5df;
        uVar3 = vClasses->pArray[uVar10];
        uVar4 = (int)uVar3 >> 2;
        if ((int)uVar4 < 0) {
LAB_002ae5fe:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar1 = pNtks[uVar3 & 1];
        pVVar2 = pAVar1->vObjs;
        if (pVVar2->nSize <= (int)uVar4) goto LAB_002ae5fe;
        pcVar6 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[uVar4]);
        pcVar9 = "NOT:";
        if ((uVar3 & 2) == 0) {
          pcVar9 = "";
        }
        fprintf(__stream,"%d:%s:%s%s\n",(ulong)local_48,pAVar1->pName,pcVar9,pcVar6);
        uVar3 = vClasses->nSize;
        if ((int)uVar3 <= (int)uVar7) goto LAB_002ae5df;
      }
      fputc(10,__stream);
      if (vClasses->nSize <= (int)uVar7) goto LAB_002ae5df;
      uVar7 = uVar7 + 1 + vClasses->pArray[uVar8];
    } while ((int)uVar7 < vClasses->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkDumpEquivFile( char * pFileName, Vec_Int_t * vClasses, Abc_Ntk_t * pNtks[2] )
{
    int i, c, k, Entry;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL ) { printf( "Cannot open file %s for writing.\n", pFileName ); return; }
    fprintf( pFile, "# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), Extra_TimeStamp() );
    for ( i = c = 0; i < Vec_IntSize(vClasses); c++, i += 1 + Vec_IntEntry(vClasses, i) )
    {
        Vec_IntForEachEntryStartStop( vClasses, Entry, k, i + 1, i + 1 + Vec_IntEntry(vClasses, i) )
        {
            Abc_Ntk_t * pNtk = pNtks[Entry & 1];
            char * pObjName = Abc_ObjName( Abc_NtkObj(pNtk, Entry>>2) );
            fprintf( pFile, "%d:%s:%s%s\n", c+1, Abc_NtkName(pNtk), (Entry&2) ? "NOT:":"", pObjName );
        }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );
}